

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satInterP.c
# Opt level: O0

int Intp_ManProofRecordOne(Intp_Man_t *p,Sto_Cls_t *pClause)

{
  lit *plVar1;
  Vec_Ptr_t *pVVar2;
  int iVar3;
  lit Lit;
  Vec_Int_t *pVVar4;
  Sto_Cls_t *pSVar5;
  uint local_30;
  uint local_2c;
  int j;
  int i;
  Sto_Cls_t *pConflict;
  Sto_Cls_t *pClause_local;
  Intp_Man_t *p_local;
  
  if ((*(uint *)&pClause->field_0x1c >> 3 & 0xffffff) == 0) {
    __assert_fail("pClause->nLits > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satInterP.c"
                  ,0x2a2,"int Intp_ManProofRecordOne(Intp_Man_t *, Sto_Cls_t *)");
  }
  if ((*(uint *)&pClause->field_0x1c >> 3 & 0xffffff) == 0) {
    printf("Error: Empty clause is attempted.\n");
  }
  if ((*(uint *)&pClause->field_0x1c >> 1 & 1) != 0) {
    __assert_fail("!pClause->fRoot",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satInterP.c"
                  ,0x2a6,"int Intp_ManProofRecordOne(Intp_Man_t *, Sto_Cls_t *)");
  }
  if (p->nTrailSize != p->nRootSize) {
    __assert_fail("p->nTrailSize == p->nRootSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satInterP.c"
                  ,0x2a7,"int Intp_ManProofRecordOne(Intp_Man_t *, Sto_Cls_t *)");
  }
  for (local_2c = 0; (int)local_2c < (int)(*(uint *)&pClause->field_0x1c >> 3 & 0xffffff);
      local_2c = local_2c + 1) {
    plVar1 = p->pAssigns;
    iVar3 = lit_var(*(lit *)((long)&pClause[1].pNext + (long)(int)local_2c * 4));
    if (plVar1[iVar3] == *(int *)((long)&pClause[1].pNext + (long)(int)local_2c * 4)) {
      pVVar2 = p->vAntClas;
      pVVar4 = Vec_IntAlloc(0);
      Vec_PtrPush(pVVar2,pVVar4);
      return 1;
    }
  }
  for (local_2c = 0; (int)local_2c < (int)(*(uint *)&pClause->field_0x1c >> 3 & 0xffffff);
      local_2c = local_2c + 1) {
    Lit = lit_neg(*(lit *)((long)&pClause[1].pNext + (long)(int)local_2c * 4));
    iVar3 = Intp_ManEnqueue(p,Lit,(Sto_Cls_t *)0x0);
    if (iVar3 == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satInterP.c"
                    ,0x2b7,"int Intp_ManProofRecordOne(Intp_Man_t *, Sto_Cls_t *)");
    }
  }
  pSVar5 = Intp_ManPropagate(p,p->nRootSize);
  if (pSVar5 == (Sto_Cls_t *)0x0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satInterP.c"
                  ,0x2bf,"int Intp_ManProofRecordOne(Intp_Man_t *, Sto_Cls_t *)");
  }
  if ((*(uint *)&pSVar5->field_0x1c >> 3 & 0xffffff) <=
      (*(uint *)&pClause->field_0x1c >> 3 & 0xffffff)) {
    for (local_2c = 0; (int)local_2c < (int)(*(uint *)&pSVar5->field_0x1c >> 3 & 0xffffff);
        local_2c = local_2c + 1) {
      local_30 = 0;
      while (((int)local_30 < (int)(*(uint *)&pClause->field_0x1c >> 3 & 0xffffff) &&
             (*(int *)((long)&pSVar5[1].pNext + (long)(int)local_2c * 4) !=
              *(int *)((long)&pClause[1].pNext + (long)(int)local_30 * 4)))) {
        local_30 = local_30 + 1;
      }
      if (local_30 == (*(uint *)&pClause->field_0x1c >> 3 & 0xffffff)) break;
    }
    if (local_2c == (*(uint *)&pSVar5->field_0x1c >> 3 & 0xffffff)) {
      Intp_ManCancelUntil(p,p->nRootSize);
      pVVar2 = p->vAntClas;
      pVVar4 = Vec_IntAlloc(0);
      Vec_PtrPush(pVVar2,pVVar4);
      return 1;
    }
  }
  Intp_ManProofTraceOne(p,pSVar5,pClause);
  Intp_ManCancelUntil(p,p->nRootSize);
  if ((*(uint *)&pClause->field_0x1c >> 3 & 0xffffff) < 2) {
    if ((*(uint *)&pClause->field_0x1c >> 3 & 0xffffff) != 1) {
      __assert_fail("pClause->nLits == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satInterP.c"
                    ,0x2e7,"int Intp_ManProofRecordOne(Intp_Man_t *, Sto_Cls_t *)");
    }
    iVar3 = Intp_ManEnqueue(p,*(lit *)&pClause[1].pNext,pClause);
    if (iVar3 == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satInterP.c"
                    ,0x2ec,"int Intp_ManProofRecordOne(Intp_Man_t *, Sto_Cls_t *)");
    }
    pSVar5 = Intp_ManPropagate(p,p->nRootSize);
    if (pSVar5 == (Sto_Cls_t *)0x0) {
      p->nRootSize = p->nTrailSize;
      p_local._4_4_ = 1;
    }
    else {
      while (iVar3 = Vec_PtrSize(p->vAntClas), iVar3 < p->pCnf->pEmpty->Id - p->nAntStart) {
        pVVar2 = p->vAntClas;
        pVVar4 = Vec_IntAlloc(0);
        Vec_PtrPush(pVVar2,pVVar4);
      }
      Intp_ManProofTraceOne(p,pSVar5,p->pCnf->pEmpty);
      p_local._4_4_ = 0;
    }
  }
  else {
    Intp_ManWatchClause(p,pClause,*(lit *)&pClause[1].pNext);
    Intp_ManWatchClause(p,pClause,*(lit *)((long)&pClause[1].pNext + 4));
    p_local._4_4_ = 1;
  }
  return p_local._4_4_;
}

Assistant:

int Intp_ManProofRecordOne( Intp_Man_t * p, Sto_Cls_t * pClause )
{
    Sto_Cls_t * pConflict;
    int i;

    // empty clause never ends up there
    assert( pClause->nLits > 0 );
    if ( pClause->nLits == 0 )
        printf( "Error: Empty clause is attempted.\n" );

    assert( !pClause->fRoot );
    assert( p->nTrailSize == p->nRootSize );

    // if any of the clause literals are already assumed
    // it means that the clause is redundant and can be skipped
    for ( i = 0; i < (int)pClause->nLits; i++ )
        if ( p->pAssigns[lit_var(pClause->pLits[i])] == pClause->pLits[i] )
        {
//            Vec_IntPush( p->vBreaks, Vec_IntSize(p->vAnties) );
            Vec_PtrPush( p->vAntClas, Vec_IntAlloc(0) );
            return 1;
        }

    // add assumptions to the trail
    for ( i = 0; i < (int)pClause->nLits; i++ )
        if ( !Intp_ManEnqueue( p, lit_neg(pClause->pLits[i]), NULL ) )
        {
            assert( 0 ); // impossible
            return 0;
        }

    // propagate the assumptions
    pConflict = Intp_ManPropagate( p, p->nRootSize );
    if ( pConflict == NULL )
    {
        assert( 0 ); // cannot prove
        return 0;
    }

    // skip the clause if it is weaker or the same as the conflict clause
    if ( pClause->nLits >= pConflict->nLits )
    {
        // check if every literal of conflict clause can be found in the given clause
        int j;
        for ( i = 0; i < (int)pConflict->nLits; i++ )
        {
            for ( j = 0; j < (int)pClause->nLits; j++ )
                if ( pConflict->pLits[i] == pClause->pLits[j] )
                    break;
            if ( j == (int)pClause->nLits ) // literal pConflict->pLits[i] is not found
                break;
        }
        if ( i == (int)pConflict->nLits ) // all lits are found
        {
            // undo to the root level
            Intp_ManCancelUntil( p, p->nRootSize );
//            Vec_IntPush( p->vBreaks, Vec_IntSize(p->vAnties) );
            Vec_PtrPush( p->vAntClas, Vec_IntAlloc(0) );
            return 1;
        }
    }

    // construct the proof
    Intp_ManProofTraceOne( p, pConflict, pClause );

    // undo to the root level
    Intp_ManCancelUntil( p, p->nRootSize );

    // add large clauses to the watched lists
    if ( pClause->nLits > 1 )
    {
        Intp_ManWatchClause( p, pClause, pClause->pLits[0] );
        Intp_ManWatchClause( p, pClause, pClause->pLits[1] );
        return 1;
    }
    assert( pClause->nLits == 1 );

    // if the clause proved is unit, add it and propagate
    if ( !Intp_ManEnqueue( p, pClause->pLits[0], pClause ) )
    {
        assert( 0 ); // impossible
        return 0;
    }

    // propagate the assumption
    pConflict = Intp_ManPropagate( p, p->nRootSize );
    if ( pConflict )
    {
        // insert place-holders till the empty clause
        while ( Vec_PtrSize(p->vAntClas) < p->pCnf->pEmpty->Id - p->nAntStart )
            Vec_PtrPush( p->vAntClas, Vec_IntAlloc(0) );
        // construct the proof for the empty clause
        Intp_ManProofTraceOne( p, pConflict, p->pCnf->pEmpty );
//        if ( p->fVerbose )
//            printf( "Found last conflict after adding unit clause number %d!\n", pClause->Id );
        return 0;
    }

    // update the root level
    p->nRootSize = p->nTrailSize;
    return 1;
}